

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall ON_SubDVertex::MarkedFaceCount(ON_SubDVertex *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  
  if (this->m_face_count == 0) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
    do {
      if (this->m_faces[uVar3] != (ON_SubDFace *)0x0) {
        bVar1 = ON_ComponentStatus::RuntimeMark
                          (&(this->m_faces[uVar3]->super_ON_SubDComponentBase).m_status);
        uVar2 = uVar2 + bVar1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < this->m_face_count);
  }
  return uVar2;
}

Assistant:

unsigned int ON_SubDVertex::MarkedFaceCount() const
{
  unsigned int mark_count = 0;
  for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
  {
    const ON_SubDFace* f = m_faces[vfi];
    if (nullptr != f && f->m_status.RuntimeMark())
      ++mark_count;
  }
  return mark_count;
}